

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O0

bool QBmpHandler::canRead(QIODevice *device)

{
  int iVar1;
  long lVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  char head [2];
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool bVar3;
  QMessageLogger *in_stack_ffffffffffffffd0;
  undefined2 local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (char *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    QMessageLogger::warning(&stack0xffffffffffffffd0,"QBmpHandler::canRead() called with 0 pointer")
    ;
    bVar3 = false;
  }
  else {
    local_a = 0xaaaa;
    lVar2 = QIODevice::peek(in_RDI,(longlong)&local_a);
    if (lVar2 == 2) {
      iVar1 = qstrncmp((char *)in_stack_ffffffffffffffd0,
                       (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                       (size_t)in_RDI);
      bVar3 = iVar1 == 0;
    }
    else {
      bVar3 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QBmpHandler::canRead(QIODevice *device)
{
    if (!device) {
        qWarning("QBmpHandler::canRead() called with 0 pointer");
        return false;
    }

    char head[2];
    if (device->peek(head, sizeof(head)) != sizeof(head))
        return false;

    return (qstrncmp(head, "BM", 2) == 0);
}